

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * sqlite3_compileoption_get(int N)

{
  char **ppcVar1;
  char **azCompileOpt;
  int nOpt;
  int N_local;
  
  azCompileOpt._4_4_ = N;
  ppcVar1 = sqlite3CompileOptions((int *)&azCompileOpt);
  if ((azCompileOpt._4_4_ < 0) || ((int)azCompileOpt <= azCompileOpt._4_4_)) {
    _nOpt = (char *)0x0;
  }
  else {
    _nOpt = ppcVar1[azCompileOpt._4_4_];
  }
  return _nOpt;
}

Assistant:

SQLITE_API const char *sqlite3_compileoption_get(int N){
  int nOpt;
  const char **azCompileOpt;
  azCompileOpt = sqlite3CompileOptions(&nOpt);
  if( N>=0 && N<nOpt ){
    return azCompileOpt[N];
  }
  return 0;
}